

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O1

void registration_service_free(registration_service_handle *rs)

{
  void *pvVar1;
  registration_service_priv *priv;
  
  pvVar1 = rs->priv;
  if (pvVar1 != (void *)0x0) {
    registration_service_stop(rs);
    worker_free((worker_handle *)((long)pvVar1 + 0x28));
    mutex_free((mutex_handle *)((long)pvVar1 + 0x20));
    free(*(void **)((long)pvVar1 + 0x10));
    free(rs->priv);
    rs->priv = (void *)0x0;
  }
  return;
}

Assistant:

void registration_service_free(struct registration_service_handle *rs)
{
	if (rs->priv != NULL) {
		struct registration_service_priv *priv = rs->priv;

		registration_service_stop(rs);

		worker_free(&priv->worker);
		mutex_free(&priv->mutex);

		free((void *)priv->reg_suffix);

		free(rs->priv);
		rs->priv = NULL;
	}
}